

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::
IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>::iterate
          (TestStatus *__return_storage_ptr__,
          IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported> *this)

{
  DrawType DVar1;
  VkPrimitiveTopology VVar2;
  Context *this_00;
  TestLog *log;
  DeviceInterface *pDVar3;
  Allocation *pAVar4;
  pointer __dest;
  Buffer *pBVar5;
  Image *this_01;
  undefined1 auVar6 [16];
  VkQueue pVVar7;
  int iVar8;
  bool bVar9;
  VkResult VVar10;
  VkDevice pVVar11;
  Allocator *pAVar12;
  long lVar13;
  char *__s;
  TestError *this_02;
  deUint32 dVar14;
  uint uVar15;
  int iVar16;
  int y;
  int iVar17;
  size_t __n;
  int x;
  int x_00;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 extraout_XMM0 [16];
  allocator<char> local_171;
  VkQueue local_170;
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  string local_a8 [32];
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.m_context;
  log = this_00->m_testCtx->m_log;
  local_170 = Context::getUniversalQueue(this_00);
  DVar1 = (this->super_IndirectDraw).m_drawType;
  if (DVar1 == DRAW_TYPE_INDEXED) {
    VVar2 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    dVar14 = 0x28;
    if (VVar2 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      referenceFrame.super_TextureLevelPyramid.m_format.order = LA;
      referenceFrame.super_TextureLevelPyramid.m_format.type = UNORM_INT16;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x400000004;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xd00000006;
    }
    else {
      if (VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x255);
        goto LAB_006884ab;
      }
      referenceFrame.super_TextureLevelPyramid.m_format.order = L;
      referenceFrame.super_TextureLevelPyramid.m_format.type = UNORM_INT16;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x400000003;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xd00000005;
    }
    referenceFrame.super_TextureLevelPyramid.m_access.
    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xfffffff900000009;
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffff5fffffffe;
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xfffffffc00000000;
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xd00000002;
    referenceFrame.m_width = 0;
    IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
              (&this->super_IndirectDraw,(VkDrawIndexedIndirectCommand *)&referenceFrame);
    IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
              (&this->super_IndirectDraw,
               (VkDrawIndexedIndirectCommand *)
               ((long)&referenceFrame.super_TextureLevelPyramid.m_data.
                       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4));
    IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
              (&this->super_IndirectDraw,
               (VkDrawIndexedIndirectCommand *)
               &referenceFrame.super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_finish);
LAB_00687df2:
    (this->super_IndirectDraw).m_strideInBuffer = dVar14;
  }
  else if (DVar1 == DRAW_TYPE_SEQUENTIAL) {
    VVar2 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    dVar14 = 0x20;
    if (VVar2 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      referenceFrame.super_TextureLevelPyramid.m_format.order = LA;
      referenceFrame.super_TextureLevelPyramid.m_format.type = UNORM_INT16;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x400000004;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x6;
    }
    else {
      if (VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x218);
        goto LAB_006884ab;
      }
      referenceFrame.super_TextureLevelPyramid.m_format.order = L;
      referenceFrame.super_TextureLevelPyramid.m_format.type = UNORM_INT16;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x400000003;
      referenceFrame.super_TextureLevelPyramid.m_access.
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x5;
    }
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffff7fffffff5;
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xfffffffefffffffc;
    referenceFrame.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
    IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
              (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&referenceFrame);
    IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
              (&this->super_IndirectDraw,
               (VkDrawIndirectCommand *)
               &referenceFrame.super_TextureLevelPyramid.m_data.
                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
              (&this->super_IndirectDraw,
               (VkDrawIndirectCommand *)&referenceFrame.super_TextureLevelPyramid.m_access);
    goto LAB_00687df2;
  }
  (this->super_IndirectDraw).m_drawCount = 2;
  (this->super_IndirectDraw).m_offsetInBuffer = 8;
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  vertexBuffer.m_internal =
       (((this->super_IndirectDraw).super_DrawTestsBaseClass.m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x58])
            (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0);
  __n = (long)(this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar11 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,(this->super_IndirectDraw).m_offsetInBuffer + __n,
             0x100,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar12 = Context::getDefaultAllocator
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar3,pVVar11,(VkBufferCreateInfo *)&referenceFrame,pAVar12,
             (MemoryRequirement)0x1);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&(this->super_IndirectDraw).m_indirectBuffer,
             (SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&referenceFrame.m_width);
  pAVar4 = (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  __dest = (pointer)pAVar4->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,&(this->super_IndirectDraw).m_junkData,(this->super_IndirectDraw).m_offsetInBuffer);
  memcpy((void *)((long)&__dest->m_ptr + (this->super_IndirectDraw).m_offsetInBuffer),
         (this->super_IndirectDraw).m_indirectBufferContents.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start,
         __n);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar11 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  pBVar5 = (this->super_IndirectDraw).m_indirectBuffer.m_ptr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00bf5e28;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar4->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar4->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar4->m_hostPtr;
  pAVar4 = (pBVar5->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00bf5e28;
  submitInfo.pNext = (void *)(pAVar4->m_memory).m_internal;
  submitInfo._16_8_ = pAVar4->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar4->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar11,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,
             __n + (this->super_IndirectDraw).m_offsetInBuffer);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_IndirectDraw).super_DrawTestsBaseClass.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  if ((this->super_IndirectDraw).m_drawType == DRAW_TYPE_INDEXED) {
    pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    (*pDVar3->_vptr_DeviceInterface[0x57])
              (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->super_IndirectDraw).m_indexBuffer.m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0);
  }
  if (((this->super_IndirectDraw).m_isMultiDrawEnabled == 0) ||
     (uVar15 = (this->super_IndirectDraw).m_drawCount,
     (this->super_IndirectDraw).m_drawIndirectMaxCount < uVar15)) {
    for (uVar15 = 0; uVar15 < (this->super_IndirectDraw).m_drawCount; uVar15 = uVar15 + 1) {
      DVar1 = (this->super_IndirectDraw).m_drawType;
      lVar13 = 0x2d8;
      if (DVar1 != DRAW_TYPE_SEQUENTIAL) {
        if (DVar1 != DRAW_TYPE_INDEXED) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"impossible",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                     ,0x29c);
          goto LAB_006884ab;
        }
        lVar13 = 0x2e0;
      }
      pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
      (**(code **)((long)pDVar3->_vptr_DeviceInterface + lVar13))
                (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_object).
                 super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (ulong)((this->super_IndirectDraw).m_strideInBuffer * uVar15) +
                 (this->super_IndirectDraw).m_offsetInBuffer,1,0);
    }
  }
  else {
    DVar1 = (this->super_IndirectDraw).m_drawType;
    lVar13 = 0x2d8;
    if (DVar1 != DRAW_TYPE_SEQUENTIAL) {
      if (DVar1 != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x28c);
LAB_006884ab:
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar13 = 0x2e0;
    }
    pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    (**(code **)((long)pDVar3->_vptr_DeviceInterface + lVar13))
              (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (this->super_IndirectDraw).m_offsetInBuffer,uVar15,
               (this->super_IndirectDraw).m_strideInBuffer);
  }
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4a])
            (pDVar3,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar7 = local_170;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  submitInfo.pCommandBuffers =
       (VkCommandBuffer *)&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer;
  VVar10 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,local_170,1);
  ::vk::checkResult(VVar10,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2af);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar10 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar7);
  ::vk::checkResult(VVar10,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b1);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar10 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar7);
  ::vk::checkResult(VVar10,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b4);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_IndirectDraw).super_DrawTestsBaseClass.m_colorAttachmentFormat
                        );
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  iVar8 = referenceFrame.m_width;
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  auVar20 = ZEXT816(0x3fe0000000000000);
  y = 0;
  iVar16 = iVar8;
  if (iVar8 < 1) {
    iVar16 = 0;
  }
  iVar17 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar17 = 0;
  }
  for (; y != iVar17; y = y + 1) {
    fVar18 = (float)y / ((float)referenceFrame.m_height * 0.5) + -1.0;
    auVar19._8_8_ = -(ulong)(0.0 < auVar20._8_8_);
    auVar19._0_8_ = -(ulong)(0.3 < fVar18);
    auVar6._8_8_ = -(ulong)(auVar20._8_8_ < 0.0);
    auVar6._0_8_ = -(ulong)(fVar18 < -0.6);
    auVar20 = auVar19 | auVar6;
    for (x_00 = 0; iVar16 != x_00; x_00 = x_00 + 1) {
      if (((auVar19 | auVar6) & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar20._0_8_ = (double)((float)x_00 / ((float)iVar8 * 0.5) + -1.0);
        if ((-0.3 <= auVar20._0_8_) && (auVar20._0_8_ <= 0.6)) {
          renderedFrame.m_format.order = R;
          renderedFrame.m_format.type = SNORM_INT8;
          renderedFrame.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
          tcu::PixelBufferAccess::setPixel
                    (referenceFrame.super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
          auVar20 = extraout_XMM0;
        }
      }
    }
  }
  this_01 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_colorTargetImage.m_ptr;
  pAVar12 = Context::getDefaultAllocator
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  Image::readSurface(&renderedFrame,this_01,local_170,pAVar12,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar9 = tcu::fuzzyCompare(log,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar9);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,__s,&local_171);
  __return_storage_ptr__->m_code = (uint)!bVar9;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,local_a8);
  std::__cxx11::string::~string(local_a8);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDrawInstanced<FirstInstanceSupport>::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						3,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
					{
						3,											//vertexCount
						4,											//instanceCount
						5,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						4,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 },
					{
						4,											//vertexCount
						4,											//instanceCount
						6,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						3,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						3,											// indexCount
						4,											// instanceCount
						5,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						4,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						4,											// indexCount
						4,											// instanceCount
						6,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy((ptr + m_offsetInBuffer), &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

	}